

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.cpp
# Opt level: O0

int64_t npas4::GetRAMVirtualAvailable(void)

{
  int64_t iVar1;
  int64_t iVar2;
  
  iVar1 = GetRAMVirtualTotal();
  iVar2 = GetRAMVirtualUsed();
  return iVar1 - iVar2;
}

Assistant:

int64_t npas4::GetRAMVirtualAvailable()
{
#ifdef WIN32
	MEMORYSTATUSEX memInfo;
	memInfo.dwLength = sizeof(MEMORYSTATUSEX);
	GlobalMemoryStatusEx(&memInfo);
	return memInfo.ullTotalPageFile;
#else
	return npas4::GetRAMVirtualTotal() - npas4::GetRAMVirtualUsed();
#endif
}